

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_open(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue val;
  JSValue val_00;
  JSValue JVar1;
  int iVar2;
  JSContext *ctx_00;
  ssize_t sVar3;
  int in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  int32_t *in_R8;
  int ret;
  int mode;
  int flags;
  char *filename;
  undefined1 in_stack_ffffffffffffff88 [12];
  undefined4 in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  val1.tag._4_4_ = in_stack_ffffffffffffff94;
  val1._0_12_ = in_stack_ffffffffffffff88;
  ctx_00 = (JSContext *)JS_ToCString((JSContext *)0x1142a2,val1);
  if (ctx_00 == (JSContext *)0x0) {
    local_30 = 0;
    local_28 = 6;
    goto LAB_001143bb;
  }
  val.tag = in_RSI;
  val.u.ptr = in_RDI.ptr;
  iVar2 = JS_ToInt32((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_R8,val);
  if (iVar2 == 0) {
    if ((in_ECX < 3) || (iVar2 = JS_IsUndefined(*(JSValue *)(in_R8 + 8)), iVar2 != 0)) {
      in_stack_ffffffffffffff98 = 0x1b6;
    }
    else {
      val_00.tag = in_RSI;
      val_00.u.ptr = in_RDI.ptr;
      iVar2 = JS_ToInt32((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_R8,val_00);
      if (iVar2 != 0) goto LAB_00114329;
    }
    open((char *)ctx_00,in_stack_ffffffffffffff9c,(ulong)in_stack_ffffffffffffff98);
    sVar3 = js_get_errno(0x114371);
    local_30 = (undefined4)sVar3;
    JS_FreeCString(ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    uStack_2c = uStack_c;
    local_28 = 0;
  }
  else {
LAB_00114329:
    JS_FreeCString(ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_30 = 0;
    local_28 = 6;
  }
LAB_001143bb:
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_open(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    const char *filename;
    int flags, mode, ret;

    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &flags, argv[1]))
        goto fail;
    if (argc >= 3 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32(ctx, &mode, argv[2])) {
        fail:
            JS_FreeCString(ctx, filename);
            return JS_EXCEPTION;
        }
    } else {
        mode = 0666;
    }
#if defined(_WIN32)
    /* force binary mode by default */
    if (!(flags & O_TEXT))
        flags |= O_BINARY;
#endif
    ret = js_get_errno(open(filename, flags, mode));
    JS_FreeCString(ctx, filename);
    return JS_NewInt32(ctx, ret);
}